

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_s16(drwav *pWav,drwav_uint64 samplesToRead,drwav_int16 *pBufferOut)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  drwav_uint64 dVar6;
  ulong uVar7;
  drwav_int32 *pdVar8;
  long lVar9;
  drwav_uint32 *pdVar10;
  drwav_int16 *pdVar11;
  int iVar12;
  drwav_int32 dVar13;
  ulong uVar14;
  uint uVar15;
  short sStack_80;
  byte bStack_7e;
  short sStack_7c;
  byte bStack_7a;
  drwav_uint64 dStack_78;
  drwav_uint32 *pdStack_70;
  drwav_uint64 dStack_68;
  long lStack_60;
  drwav_uint32 *pdStack_58;
  drwav_int16 *pdStack_50;
  drwav_int32 *pdStack_48;
  ulong uStack_40;
  long lStack_38;
  int iVar16;
  
  if (pBufferOut != (drwav_int16 *)0x0 && (samplesToRead != 0 && pWav != (drwav *)0x0)) {
    switch(pWav->translatedFormatTag) {
    case 1:
      dVar6 = drwav_read_s16__pcm(pWav,samplesToRead,pBufferOut);
      return dVar6;
    case 2:
      dVar6 = drwav_read_s16__msadpcm(pWav,samplesToRead,pBufferOut);
      return dVar6;
    case 3:
      dVar6 = drwav_read_s16__ieee(pWav,samplesToRead,pBufferOut);
      return dVar6;
    case 4:
    case 5:
      break;
    case 6:
      dVar6 = drwav_read_s16__alaw(pWav,samplesToRead,pBufferOut);
      return dVar6;
    case 7:
      dVar6 = drwav_read_s16__mulaw(pWav,samplesToRead,pBufferOut);
      return dVar6;
    default:
      if (pWav->translatedFormatTag == 0x11) {
        pdStack_70 = &(pWav->ima).cachedSampleCount;
        pdStack_48 = (pWav->ima).cachedSamples;
        dVar6 = 0;
LAB_0010a1b8:
        do {
          if (samplesToRead == 0) {
            return dVar6;
          }
          if (pWav->totalSampleCount <= (pWav->compressed).iCurrentSample) {
            return dVar6;
          }
          uVar15 = *pdStack_70;
          if ((uVar15 == 0) && (uVar15 = 0, (pWav->ima).bytesRemainingInBlock == 0)) {
            if (pWav->channels == 1) {
              sVar5 = (*pWav->onRead)(pWav->pUserData,&sStack_80,4);
              if (sVar5 != 4) {
                return dVar6;
              }
              (pWav->ima).bytesRemainingInBlock = (pWav->fmt).blockAlign - 4;
              (pWav->ima).predictor[0] = (int)sStack_80;
              (pWav->ima).stepIndex[0] = (uint)bStack_7e;
              (pWav->ima).cachedSamples[0xf] = (int)sStack_80;
              (pWav->ima).cachedSampleCount = 1;
              uVar15 = 1;
            }
            else {
              sVar5 = (*pWav->onRead)(pWav->pUserData,&sStack_80,8);
              if (sVar5 != 8) {
                return dVar6;
              }
              (pWav->ima).bytesRemainingInBlock = (pWav->fmt).blockAlign - 8;
              (pWav->ima).predictor[0] = (int)sStack_80;
              (pWav->ima).stepIndex[0] = (uint)bStack_7e;
              (pWav->ima).predictor[1] = (int)sStack_7c;
              (pWav->ima).stepIndex[1] = (uint)bStack_7a;
              (pWav->ima).cachedSamples[0xe] = (int)sStack_80;
              (pWav->ima).cachedSamples[0xf] = (int)sStack_7c;
              (pWav->ima).cachedSampleCount = 2;
              uVar15 = 2;
            }
          }
          uVar7 = (ulong)uVar15;
          dStack_78 = dVar6 + uVar7;
          dStack_68 = samplesToRead - uVar7;
          lVar9 = 0;
          pdVar11 = pBufferOut;
          uVar3 = uVar15;
          while( true ) {
            uVar3 = uVar3 - 1;
            if (samplesToRead - lVar9 == 0) {
              return dVar6 + samplesToRead;
            }
            if ((uint)lVar9 == uVar15) {
              samplesToRead = dStack_68;
              dVar6 = dStack_78;
              pBufferOut = pdVar11;
              if ((pWav->ima).bytesRemainingInBlock != 0) {
                uVar2 = pWav->channels;
                (pWav->ima).cachedSampleCount = (uint)uVar2 << 3;
                pdStack_58 = pdStack_70;
                lStack_60 = 0x10;
                uVar7 = (ulong)uVar2;
                pdStack_50 = pdVar11;
                for (uVar14 = 0; samplesToRead = dStack_68, dVar6 = dStack_78,
                    pBufferOut = pdStack_50, uVar14 < uVar7; uVar14 = uVar14 + 1) {
                  sVar5 = (*pWav->onRead)(pWav->pUserData,&sStack_80,4);
                  if (sVar5 != 4) {
                    return dStack_78;
                  }
                  (pWav->ima).bytesRemainingInBlock = (pWav->ima).bytesRemainingInBlock - 4;
                  uVar2 = pWav->channels;
                  pdVar8 = pdStack_48 + lStack_60 + (ulong)uVar2;
                  uStack_40 = (ulong)uVar2;
                  uVar7 = (ulong)uVar2;
                  lStack_38 = uVar7 * 8;
                  pdVar10 = pdStack_58;
                  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
                    bVar1 = *(byte *)((long)&sStack_80 + lVar9);
                    uVar3 = bVar1 & 0xf;
                    iVar12 = (pWav->ima).stepIndex[uVar14];
                    uVar15 = drwav_read_s16__ima::stepTable[iVar12];
                    iVar4 = ((int)(uVar3 << 0x1d) >> 0x1f & uVar15) +
                            ((int)uVar15 >> 1 & (int)(uVar3 << 0x1e) >> 0x1f) +
                            ((int)uVar15 >> 2 & -(bVar1 & 1)) + ((int)uVar15 >> 3);
                    iVar16 = -iVar4;
                    if ((byte)uVar3 < 8) {
                      iVar16 = iVar4;
                    }
                    uVar15 = iVar16 + (pWav->ima).predictor[uVar14];
                    if (0x7ffe < (int)uVar15) {
                      uVar15 = 0x7fff;
                    }
                    if ((int)uVar15 < -0x7fff) {
                      uVar15 = 0xffff8000;
                    }
                    (pWav->ima).predictor[uVar14] = uVar15;
                    iVar12 = iVar12 + drwav_read_s16__ima::indexTable[uVar3];
                    if (0x57 < iVar12) {
                      iVar12 = 0x58;
                    }
                    if (iVar12 < 1) {
                      iVar12 = 0;
                    }
                    (pWav->ima).stepIndex[uVar14] = iVar12;
                    pdVar10[-(ulong)(pWav->ima).cachedSampleCount] = uVar15;
                    iVar12 = (pWav->ima).stepIndex[uVar14];
                    uVar15 = drwav_read_s16__ima::stepTable[iVar12];
                    iVar4 = ((int)((uint)bVar1 << 0x19) >> 0x1f & uVar15) + ((int)uVar15 >> 3) +
                            ((int)uVar15 >> 2 & -(uint)((bVar1 >> 4 & 1) != 0)) +
                            ((int)uVar15 >> 1 & (int)((uint)bVar1 << 0x1a) >> 0x1f);
                    iVar16 = -iVar4;
                    if (-1 < (char)bVar1) {
                      iVar16 = iVar4;
                    }
                    dVar13 = iVar16 + (pWav->ima).predictor[uVar14];
                    if (0x7ffe < dVar13) {
                      dVar13 = 0x7fff;
                    }
                    if (dVar13 < -0x7fff) {
                      dVar13 = -0x8000;
                    }
                    (pWav->ima).predictor[uVar14] = dVar13;
                    iVar12 = iVar12 + drwav_read_s16__ima::indexTable[bVar1 >> 4];
                    if (0x57 < iVar12) {
                      iVar12 = 0x58;
                    }
                    if (iVar12 < 1) {
                      iVar12 = 0;
                    }
                    (pWav->ima).stepIndex[uVar14] = iVar12;
                    pdVar8[-(ulong)(pWav->ima).cachedSampleCount] = dVar13;
                    pdVar8 = pdVar8 + uVar7 * 2;
                    pdVar10 = pdVar10 + uVar7 * 2;
                  }
                  lStack_60 = lStack_60 + 1;
                  pdStack_58 = pdStack_58 + 1;
                  uVar7 = uStack_40;
                }
              }
              goto LAB_0010a1b8;
            }
            uVar14 = (pWav->compressed).iCurrentSample;
            if (pWav->totalSampleCount <= uVar14) break;
            pBufferOut[lVar9] = (drwav_int16)pdStack_70[lVar9 - uVar7];
            (pWav->ima).cachedSampleCount = uVar3;
            pdVar11 = pdVar11 + 1;
            (pWav->compressed).iCurrentSample = uVar14 + 1;
            lVar9 = lVar9 + 1;
          }
          samplesToRead = samplesToRead - lVar9;
          dVar6 = dVar6 + lVar9;
          pBufferOut = pdVar11;
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

drwav_uint64 drwav_read_s16(drwav* pWav, drwav_uint64 samplesToRead, drwav_int16* pBufferOut)
{
    if (pWav == NULL || samplesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    // Don't try to read more samples than can potentially fit in the output buffer.
    if (samplesToRead * sizeof(drwav_int16) > DRWAV_SIZE_MAX) {
        samplesToRead = DRWAV_SIZE_MAX / sizeof(drwav_int16);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_s16__pcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_s16__msadpcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_s16__ieee(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_s16__alaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_s16__mulaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_s16__ima(pWav, samplesToRead, pBufferOut);
    }

    return 0;
}